

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~ArrayBuilder
          (ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *this)

{
  ExtendInfo *pEVar1;
  RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *pRVar2;
  ExtendInfo *pEVar3;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (ExtendInfo *)0x0) {
    pRVar2 = this->pos;
    pEVar3 = this->endPtr;
    this->ptr = (ExtendInfo *)0x0;
    this->pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
    this->endPtr = (ExtendInfo *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pEVar1,0x48,((long)pRVar2 - (long)pEVar1) / 0x48,
               ((long)pEVar3 - (long)pEVar1) / 0x48,
               ArrayDisposer::
               Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }